

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult(secp256k1_ecmult_context *ctx,secp256k1_gej *r,secp256k1_gej *a,
                     secp256k1_scalar *na,secp256k1_scalar *ng)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  bool bVar107;
  undefined4 in_EAX;
  int iVar108;
  uint uVar109;
  uint uVar110;
  ulong *puVar111;
  ulong uVar112;
  long lVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  uint uVar117;
  ulong *puVar118;
  secp256k1_ge *psVar119;
  uint64_t *puVar120;
  ulong *puVar121;
  secp256k1_ge *psVar122;
  ulong uVar123;
  ulong uVar124;
  long lVar125;
  long lVar126;
  byte bVar127;
  undefined1 auVar128 [16];
  uint64_t tmp3;
  secp256k1_fe Z;
  uint64_t tmp3_1;
  uint64_t tmp2_1;
  uint64_t tmp1_1;
  secp256k1_strauss_point_state ps [1];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_ge pre_a [8];
  secp256k1_ge pre_a_lam [8];
  secp256k1_fe zr [8];
  secp256k1_gej prej [8];
  secp256k1_ge local_1460;
  secp256k1_scalar *local_1408;
  secp256k1_gej *local_1400;
  undefined1 local_13f8 [16];
  ulong uStack_13e8;
  undefined1 local_13e0 [16];
  uint64_t local_13b8;
  uint64_t uStack_13b0;
  undefined1 local_13a8 [16];
  uint64_t local_1398;
  uint64_t uStack_1390;
  undefined1 local_1388 [16];
  secp256k1_scalar local_1378;
  secp256k1_scalar local_1358;
  uint local_1338 [128];
  uint auStack_1138 [130];
  uint local_f30;
  uint local_f2c;
  long local_f28;
  uint uStack_f1c;
  ulong local_f18 [65];
  uint uStack_d0c;
  ulong local_d08 [66];
  secp256k1_ge local_af8 [8];
  ulong local_838 [88];
  secp256k1_gej local_578 [2];
  secp256k1_gej local_438 [8];
  
  bVar127 = 0;
  auVar128._0_4_ = -(uint)((int)na->d[2] == 0 && (int)na->d[0] == 0);
  auVar128._4_4_ = -(uint)(*(int *)((long)na->d + 0x14) == 0 && *(int *)((long)na->d + 4) == 0);
  auVar128._8_4_ = -(uint)((int)na->d[3] == 0 && (int)na->d[1] == 0);
  auVar128._12_4_ = -(uint)(*(int *)((long)na->d + 0x1c) == 0 && *(int *)((long)na->d + 0xc) == 0);
  iVar108 = movmskps(in_EAX,auVar128);
  if ((iVar108 == 0xf) || (a->infinity != 0)) {
    local_13f8._0_8_ = 1;
    stack0xffffffffffffec10 = (undefined1  [16])0x0;
    local_13e0 = (undefined1  [16])0x0;
    uVar117 = 0;
    bVar107 = false;
  }
  else {
    local_f28 = 0;
    local_1408 = ng;
    local_1400 = r;
    secp256k1_scalar_split_lambda(&local_1378,&local_1358,na);
    iVar108 = (int)na;
    local_f30 = secp256k1_ecmult_wnaf
                          ((int *)local_1338,(int)&local_1378,(secp256k1_scalar *)0x5,iVar108);
    local_f2c = secp256k1_ecmult_wnaf
                          ((int *)(auStack_1138 + 1),(int)&local_1358,(secp256k1_scalar *)0x5,
                           iVar108);
    uVar109 = local_f2c;
    if ((int)local_f2c < (int)local_f30) {
      uVar109 = local_f30;
    }
    secp256k1_ecmult_odd_multiples_table
              ((int)local_438,local_578,&a[local_f28].x,(secp256k1_gej *)(ulong)local_f30);
    secp256k1_ge_globalz_set_table_gej
              (8,local_af8,(secp256k1_fe *)local_13f8,local_438,&local_578[0].x);
    lVar125 = 0;
    do {
      puVar111 = (ulong *)((long)local_838 + lVar125);
      puVar118 = (ulong *)((long)local_af8[0].x.n + lVar125);
      puVar121 = puVar111;
      for (lVar126 = 0xb; lVar126 != 0; lVar126 = lVar126 + -1) {
        *puVar121 = *puVar118;
        puVar118 = puVar118 + (ulong)bVar127 * -2 + 1;
        puVar121 = puVar121 + (ulong)bVar127 * -2 + 1;
      }
      uVar116 = *puVar111;
      uVar124 = *(ulong *)((long)local_838 + lVar125 + 8);
      uVar1 = *(ulong *)((long)local_838 + lVar125 + 0x10);
      uVar2 = *(ulong *)((long)local_838 + lVar125 + 0x18);
      uVar3 = *(ulong *)((long)local_838 + lVar125 + 0x20);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar2;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar1;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar124;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar116;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar3;
      uVar112 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar44,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar112 & 0xfffffffffffff;
      auVar128 = ZEXT816(0x7512f58995c13) * auVar41 + ZEXT816(0x96c28719501ee) * auVar40 +
                 ZEXT816(0xc3434e99cf049) * auVar42 + ZEXT816(0x7106e64479ea) * auVar43 +
                 auVar5 * ZEXT816(0x1000003d10);
      uVar114 = auVar128._0_8_;
      local_d08[0] = uVar114 & 0xfffffffffffff;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar114 >> 0x34 | auVar128._8_8_ << 0xc;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar3;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar2;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar1;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar124;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar116;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar112 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar44,8) << 0xc;
      auVar128 = ZEXT816(0x96c28719501ee) * auVar45 + auVar92 + ZEXT816(0x7512f58995c13) * auVar46 +
                 ZEXT816(0xc3434e99cf049) * auVar47 + ZEXT816(0x7106e64479ea) * auVar48 +
                 ZEXT816(0x7ae96a2b657c) * auVar49 + auVar6 * ZEXT816(0x1000003d10);
      uVar112 = auVar128._0_8_;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar112 >> 0x34 | auVar128._8_8_ << 0xc;
      local_1460.x.n[0] = (uVar112 & 0xfffffffffffff) >> 0x30;
      local_f18[0] = uVar112 & 0xffffffffffff;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar116;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar3;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar2;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar1;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar124;
      auVar128 = ZEXT816(0x7512f58995c13) * auVar51 + auVar93 + ZEXT816(0xc3434e99cf049) * auVar52 +
                 ZEXT816(0x7106e64479ea) * auVar53 + ZEXT816(0x7ae96a2b657c) * auVar54;
      uVar114 = auVar128._0_8_;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar114 >> 0x34 | auVar128._8_8_ << 0xc;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = (uVar114 & 0xfffffffffffff) << 4 | local_1460.x.n[0];
      uVar114 = auVar10._0_8_;
      auVar10 = ZEXT816(0x96c28719501ee) * auVar50 + ZEXT816(0x1000003d1) * auVar55;
      *puVar111 = uVar114 & 0xfffffffffffff;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar114 >> 0x34 | auVar10._8_8_ << 0xc;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar124;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar116;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar3;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar2;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar1;
      auVar5 = ZEXT816(0xc3434e99cf049) * auVar58 + auVar95 + ZEXT816(0x7106e64479ea) * auVar59 +
               ZEXT816(0x7ae96a2b657c) * auVar60;
      uVar114 = auVar5._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar114 & 0xfffffffffffff;
      auVar128 = ZEXT816(0x96c28719501ee) * auVar56 + auVar94 + ZEXT816(0x7512f58995c13) * auVar57 +
                 auVar7 * ZEXT816(0x1000003d10);
      uVar115 = auVar128._0_8_;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar114 >> 0x34 | auVar5._8_8_ << 0xc;
      *(ulong *)((long)local_838 + lVar125 + 8) = uVar115 & 0xfffffffffffff;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar115 >> 0x34 | auVar128._8_8_ << 0xc;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar1;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar124;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar116;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar3;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar2;
      auVar5 = ZEXT816(0x7106e64479ea) * auVar64 + auVar97 + ZEXT816(0x7ae96a2b657c) * auVar65;
      uVar116 = auVar5._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar116 & 0xfffffffffffff;
      auVar128 = ZEXT816(0x96c28719501ee) * auVar61 + auVar96 + ZEXT816(0x7512f58995c13) * auVar62 +
                 ZEXT816(0xc3434e99cf049) * auVar63 + auVar8 * ZEXT816(0x1000003d10);
      uVar124 = auVar128._0_8_;
      na = (secp256k1_scalar *)(uVar116 >> 0x34 | auVar5._8_8_ << 0xc);
      *(ulong *)((long)local_838 + lVar125 + 0x10) = uVar124 & 0xfffffffffffff;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = (uVar124 >> 0x34 | auVar128._8_8_ << 0xc) + local_d08[0];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = na;
      auVar98 = auVar9 * ZEXT816(0x1000003d10) + auVar98;
      uVar116 = auVar98._0_8_;
      *(ulong *)((long)local_838 + lVar125 + 0x18) = uVar116 & 0xfffffffffffff;
      *(ulong *)((long)local_838 + lVar125 + 0x20) =
           (uVar116 >> 0x34 | auVar98._8_8_ << 0xc) + (uVar112 & 0xffffffffffff);
      lVar125 = lVar125 + 0x58;
    } while (lVar125 != 0x2c0);
    uVar117 = 0;
    if (0 < (int)uVar109) {
      uVar117 = uVar109;
    }
    bVar107 = true;
    r = local_1400;
    ng = local_1408;
  }
  iVar108 = (int)na;
  if (ng == (secp256k1_scalar *)0x0) {
    lVar125 = 0;
    lVar126 = 0;
  }
  else {
    local_1398 = ng->d[0];
    uStack_1390 = ng->d[1];
    local_1388 = (undefined1  [16])0x0;
    local_13b8 = ng->d[2];
    uStack_13b0 = ng->d[3];
    local_13a8 = (undefined1  [16])0x0;
    uVar109 = secp256k1_ecmult_wnaf
                        ((int *)local_d08,(int)&local_1398,(secp256k1_scalar *)0xf,iVar108);
    uVar110 = secp256k1_ecmult_wnaf
                        ((int *)local_f18,(int)&local_13b8,(secp256k1_scalar *)0xf,iVar108);
    if ((int)uVar117 < (int)uVar109) {
      uVar117 = uVar109;
    }
    if ((int)uVar117 < (int)uVar110) {
      uVar117 = uVar110;
    }
    lVar126 = (long)(int)uVar110;
    lVar125 = (long)(int)uVar109;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (uVar117 != 0) {
    uVar116 = (ulong)uVar117;
    do {
      if (r->infinity == 0) {
        secp256k1_gej_double(r,r);
      }
      else {
        r->infinity = 1;
      }
      if (bVar107) {
        if (((long)uVar116 <= (long)(int)local_f30) &&
           (uVar117 = local_1338[uVar116 - 1], uVar117 != 0)) {
          if ((int)uVar117 < 1) {
            psVar119 = local_af8 + (~uVar117 >> 1);
            psVar122 = &local_1460;
            for (lVar113 = 0xb; lVar113 != 0; lVar113 = lVar113 + -1) {
              (psVar122->x).n[0] = (psVar119->x).n[0];
              psVar119 = (secp256k1_ge *)((long)psVar119 + ((ulong)bVar127 * -2 + 1) * 8);
              psVar122 = (secp256k1_ge *)((long)psVar122 + (ulong)bVar127 * -0x10 + 8);
            }
            local_1460.y.n[0] = 0x3ffffbfffff0bc - local_1460.y.n[0];
            local_1460.y.n[1] = 0x3ffffffffffffc - local_1460.y.n[1];
            local_1460.y.n[2] = 0x3ffffffffffffc - local_1460.y.n[2];
            local_1460.y.n[3] = 0x3ffffffffffffc - local_1460.y.n[3];
            local_1460.y.n[4] = 0x3fffffffffffc - local_1460.y.n[4];
          }
          else {
            psVar119 = local_af8 + (uVar117 - 1 >> 1);
            psVar122 = &local_1460;
            for (lVar113 = 0xb; lVar113 != 0; lVar113 = lVar113 + -1) {
              (psVar122->x).n[0] = (psVar119->x).n[0];
              psVar119 = (secp256k1_ge *)((long)psVar119 + ((ulong)bVar127 * -2 + 1) * 8);
              psVar122 = (secp256k1_ge *)((long)psVar122 + (ulong)bVar127 * -0x10 + 8);
            }
          }
          secp256k1_gej_add_ge_var(r,r,&local_1460,(secp256k1_fe *)0x0);
        }
        if (((long)uVar116 <= (long)(int)local_f2c) &&
           (uVar117 = auStack_1138[uVar116], uVar117 != 0)) {
          if ((int)uVar117 < 1) {
            puVar120 = local_838 + (ulong)(~uVar117 >> 1) * 0xb;
            psVar119 = &local_1460;
            for (lVar113 = 0xb; lVar113 != 0; lVar113 = lVar113 + -1) {
              (psVar119->x).n[0] = *puVar120;
              puVar120 = puVar120 + (ulong)bVar127 * -2 + 1;
              psVar119 = (secp256k1_ge *)((long)psVar119 + (ulong)bVar127 * -0x10 + 8);
            }
            local_1460.y.n[0] = 0x3ffffbfffff0bc - local_1460.y.n[0];
            local_1460.y.n[1] = 0x3ffffffffffffc - local_1460.y.n[1];
            local_1460.y.n[2] = 0x3ffffffffffffc - local_1460.y.n[2];
            local_1460.y.n[3] = 0x3ffffffffffffc - local_1460.y.n[3];
            local_1460.y.n[4] = 0x3fffffffffffc - local_1460.y.n[4];
          }
          else {
            puVar120 = local_838 + (ulong)(uVar117 - 1 >> 1) * 0xb;
            psVar119 = &local_1460;
            for (lVar113 = 0xb; lVar113 != 0; lVar113 = lVar113 + -1) {
              (psVar119->x).n[0] = *puVar120;
              puVar120 = puVar120 + (ulong)bVar127 * -2 + 1;
              psVar119 = (secp256k1_ge *)((long)psVar119 + (ulong)bVar127 * -0x10 + 8);
            }
          }
          secp256k1_gej_add_ge_var(r,r,&local_1460,(secp256k1_fe *)0x0);
        }
      }
      if (((long)uVar116 <= lVar125) && (uVar117 = (&uStack_d0c)[uVar116], uVar117 != 0)) {
        if ((int)uVar117 < 1) {
          secp256k1_ge_from_storage
                    (&local_1460,
                     (secp256k1_ge_storage *)(ctx->pre_g + (ulong)(~uVar117 >> 1) * 0x40));
          local_1460.y.n[0] = 0x3ffffbfffff0bc - local_1460.y.n[0];
          local_1460.y.n[1] = 0x3ffffffffffffc - local_1460.y.n[1];
          local_1460.y.n[2] = 0x3ffffffffffffc - local_1460.y.n[2];
          local_1460.y.n[3] = 0x3ffffffffffffc - local_1460.y.n[3];
          local_1460.y.n[4] = 0x3fffffffffffc - local_1460.y.n[4];
        }
        else {
          secp256k1_ge_from_storage
                    (&local_1460,
                     (secp256k1_ge_storage *)(ctx->pre_g + (ulong)(uVar117 - 1 >> 1) * 0x40));
        }
        secp256k1_gej_add_zinv_var(r,r,&local_1460,(secp256k1_fe *)local_13f8);
      }
      if (((long)uVar116 <= lVar126) && (uVar117 = (&uStack_f1c)[uVar116], uVar117 != 0)) {
        if ((int)uVar117 < 1) {
          secp256k1_ge_from_storage
                    (&local_1460,
                     (secp256k1_ge_storage *)(ctx->pre_g_128 + (ulong)(~uVar117 >> 1) * 0x40));
          local_1460.y.n[0] = 0x3ffffbfffff0bc - local_1460.y.n[0];
          local_1460.y.n[1] = 0x3ffffffffffffc - local_1460.y.n[1];
          local_1460.y.n[2] = 0x3ffffffffffffc - local_1460.y.n[2];
          local_1460.y.n[3] = 0x3ffffffffffffc - local_1460.y.n[3];
          local_1460.y.n[4] = 0x3fffffffffffc - local_1460.y.n[4];
        }
        else {
          secp256k1_ge_from_storage
                    (&local_1460,
                     (secp256k1_ge_storage *)(ctx->pre_g_128 + (ulong)(uVar117 - 1 >> 1) * 0x40));
        }
        secp256k1_gej_add_zinv_var(r,r,&local_1460,(secp256k1_fe *)local_13f8);
      }
      bVar4 = 1 < (long)uVar116;
      uVar116 = uVar116 - 1;
    } while (bVar4);
    if (r->infinity == 0) {
      uVar116 = (r->z).n[0];
      uVar124 = (r->z).n[1];
      uVar1 = (r->z).n[2];
      uVar2 = (r->z).n[3];
      uVar3 = (r->z).n[4];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_13f8._0_8_;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar2;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_13f8._8_8_;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uStack_13e8;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar124;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_13e0._0_8_;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar116;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_13e0._8_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar3;
      uVar112 = SUB168(auVar14 * auVar70,0);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar112 & 0xfffffffffffff;
      auVar10 = auVar11 * auVar67 + auVar10 * auVar66 + auVar12 * auVar68 + auVar13 * auVar69 +
                auVar15 * ZEXT816(0x1000003d10);
      uVar114 = auVar10._0_8_;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar114 >> 0x34 | auVar10._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_13f8._0_8_;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar3;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_13f8._8_8_;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar2;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uStack_13e8;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar1;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_13e0._0_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar124;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_13e0._8_8_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar116;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar112 >> 0x34 | SUB168(auVar14 * auVar70,8) << 0xc;
      auVar10 = auVar16 * auVar71 + auVar99 + auVar17 * auVar72 + auVar18 * auVar73 +
                auVar19 * auVar74 + auVar20 * auVar75 + auVar21 * ZEXT816(0x1000003d10);
      uVar112 = auVar10._0_8_;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uVar112 >> 0x34 | auVar10._8_8_ << 0xc;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_13f8._0_8_;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar116;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_13f8._8_8_;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar3;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uStack_13e8;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar2;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_13e0._0_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar1;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_13e0._8_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar124;
      auVar10 = auVar23 * auVar77 + auVar101 + auVar24 * auVar78 + auVar25 * auVar79 +
                auVar26 * auVar80;
      uVar115 = auVar10._0_8_;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uVar115 >> 0x34 | auVar10._8_8_ << 0xc;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = (uVar115 & 0xfffffffffffff) << 4 | (uVar112 & 0xfffffffffffff) >> 0x30;
      uVar115 = auVar100._0_8_;
      auVar100 = auVar22 * auVar76 + ZEXT816(0x1000003d1) * auVar81;
      (r->z).n[0] = uVar115 & 0xfffffffffffff;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = uVar115 >> 0x34 | auVar100._8_8_ << 0xc;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_13f8._0_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar124;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_13f8._8_8_;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar116;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uStack_13e8;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar3;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_13e0._0_8_;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar2;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_13e0._8_8_;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar1;
      auVar128 = auVar29 * auVar84 + auVar103 + auVar30 * auVar85 + auVar31 * auVar86;
      uVar115 = auVar128._0_8_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar115 & 0xfffffffffffff;
      auVar10 = auVar27 * auVar82 + auVar102 + auVar28 * auVar83 + auVar32 * ZEXT816(0x1000003d10);
      uVar123 = auVar10._0_8_;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = uVar115 >> 0x34 | auVar128._8_8_ << 0xc;
      (r->z).n[1] = uVar123 & 0xfffffffffffff;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = uVar123 >> 0x34 | auVar10._8_8_ << 0xc;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_13f8._0_8_;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar1;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_13f8._8_8_;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar124;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uStack_13e8;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar116;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_13e0._0_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar3;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_13e0._8_8_;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar2;
      auVar128 = auVar36 * auVar90 + auVar105 + auVar37 * auVar91;
      uVar116 = auVar128._0_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar116 & 0xfffffffffffff;
      auVar10 = auVar33 * auVar87 + auVar104 + auVar34 * auVar88 + auVar35 * auVar89 +
                auVar38 * ZEXT816(0x1000003d10);
      uVar124 = auVar10._0_8_;
      (r->z).n[2] = uVar124 & 0xfffffffffffff;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = (uVar124 >> 0x34 | auVar10._8_8_ << 0xc) + (uVar114 & 0xfffffffffffff);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar116 >> 0x34 | auVar128._8_8_ << 0xc;
      auVar106 = auVar39 * ZEXT816(0x1000003d10) + auVar106;
      uVar116 = auVar106._0_8_;
      (r->z).n[3] = uVar116 & 0xfffffffffffff;
      (r->z).n[4] = (uVar116 >> 0x34 | auVar106._8_8_ << 0xc) + (uVar112 & 0xffffffffffff);
    }
  }
  return;
}

Assistant:

static void secp256k1_ecmult(const secp256k1_ecmult_context *ctx, secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_state state;

    state.prej = prej;
    state.zr = zr;
    state.pre_a = pre_a;
    state.pre_a_lam = pre_a_lam;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(ctx, &state, r, 1, a, na, ng);
}